

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherInotify::run(FileWatcherInotify *this)

{
  uint uVar1;
  WatcherInotify *pWVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  ssize_t sVar6;
  pointer ppVar7;
  Mutex *pMVar8;
  size_type sVar9;
  size_type sVar10;
  pointer ppVar11;
  reference ppVar12;
  reference ppWVar13;
  Watcher *pWVar14;
  bool bVar15;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  FileSystem local_390 [32];
  string local_370 [32];
  Watcher *local_350;
  Watcher *cntWatch;
  Watcher *rmWatch;
  undefined1 local_338 [8];
  reverse_iterator eit;
  string local_328 [40];
  Watcher **local_300;
  Watcher **local_2f8;
  byte local_2ea;
  byte local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  WatcherInotify *local_2a8;
  Watcher *oldWatch;
  Lock local_298;
  Lock lock_1;
  vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> eraseWatches;
  string *oldFileName;
  Watcher *watch;
  __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_260;
  iterator itm;
  iterator iStack_250;
  bool found;
  __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_248;
  iterator it;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  movedOutsideWatches;
  allocator local_1f9;
  string local_1f8 [32];
  pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  _Self local_138;
  long local_130;
  _Base_ptr local_128;
  Lock local_120;
  Lock lock;
  inotify_event *pevent;
  ssize_t i;
  ssize_t len;
  undefined1 local_f0 [8];
  timeval timeout;
  fd_set *__arr;
  undefined1 local_d0 [4];
  uint __i;
  fd_set rfds;
  string prevOldFileName;
  int local_2c;
  bool lastWasMovedFrom;
  WatcherInotify *pWStack_28;
  u_int32_t currentMoveCookie;
  WatcherInotify *currentMoveFrom;
  iterator wit;
  char *buff;
  FileWatcherInotify *this_local;
  
  wit._M_node = (_Base_ptr)operator_new__(0x404000);
  memset(wit._M_node,0,0x404000);
  std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *)&currentMoveFrom);
  pWStack_28 = (WatcherInotify *)0x0;
  local_2c = -1;
  bVar15 = false;
  std::__cxx11::string::string((string *)(rfds.fds_bits + 0xf));
  do {
    timeout.tv_usec = (__suseconds_t)local_d0;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(timeout.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
    }
    iVar5 = this->mFD;
    iVar3 = iVar5;
    if (iVar5 < 0) {
      iVar3 = iVar5 + 0x3f;
    }
    *(ulong *)(local_d0 + (long)(iVar3 >> 6) * 8) =
         *(ulong *)(local_d0 + (long)(iVar3 >> 6) * 8) | 1L << ((ulong)(byte)iVar5 & 0x3f);
    local_f0 = (undefined1  [8])0x0;
    timeout.tv_sec = 100000;
    iVar5 = select(0x400,(fd_set *)local_d0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_f0);
    if (iVar5 < 1) {
      if (pWStack_28 != (WatcherInotify *)0x0) {
        std::make_pair<efsw::WatcherInotify*&,std::__cxx11::string&>
                  ((pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&movedOutsideWatches.
                       super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffffd8,
                   &(pWStack_28->super_Watcher).OldFileName);
        std::
        vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&this->mMovedOutsideWatches,
                    (value_type *)
                    &movedOutsideWatches.
                     super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&movedOutsideWatches.
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      pWStack_28 = (WatcherInotify *)0x0;
      local_2c = -1;
    }
    else {
      sVar6 = read(this->mFD,wit._M_node,0x404000);
      if (sVar6 != -1) {
        for (pevent = (inotify_event *)0x0; (long)pevent < sVar6;
            pevent = (inotify_event *)
                     ((long)&pevent[1].wd + (ulong)*(uint *)((long)&lock.mMutex[1].mMutexImpl + 4)))
        {
          lock.mMutex = (Mutex *)((long)&pevent->wd + (long)&(wit._M_node)->_M_color);
          Lock::Lock(&local_120,&this->mWatchesLock);
          local_130 = (long)*(int *)&(lock.mMutex)->mMutexImpl;
          local_128 = (_Base_ptr)
                      std::
                      map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                      ::find(&this->mWatches,&local_130);
          currentMoveFrom = (WatcherInotify *)local_128;
          Lock::~Lock(&local_120);
          local_138._M_node =
               (_Base_ptr)
               std::
               map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
               ::end(&this->mWatches);
          bVar4 = std::operator!=((_Self *)&currentMoveFrom,&local_138);
          if (bVar4) {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *
                                )&currentMoveFrom);
            pWVar2 = ppVar7->second;
            pMVar8 = lock.mMutex + 2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_158,(char *)pMVar8,&local_159);
            uVar1 = *(uint *)((long)&(lock.mMutex)->mMutexImpl + 4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_180,"",&local_181);
            (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                      (this,pWVar2,local_158,(ulong)uVar1,local_180);
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator((allocator<char> *)&local_181);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator((allocator<char> *)&local_159);
            if (((((ulong)(lock.mMutex)->mMutexImpl & 0x8000000000) == 0) ||
                (ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                          operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>
                                      *)&currentMoveFrom), ppVar7->second != pWStack_28)) ||
               (*(int *)&lock.mMutex[1].mMutexImpl != local_2c)) {
              if (((ulong)(lock.mMutex)->mMutexImpl & 0x4000000000) == 0) {
                if (pWStack_28 != (WatcherInotify *)0x0) {
                  std::make_pair<efsw::WatcherInotify*&,std::__cxx11::string&>
                            (&local_1d8,&stack0xffffffffffffffd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (rfds.fds_bits + 0xf));
                  std::
                  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push_back(&this->mMovedOutsideWatches,&local_1d8);
                  std::
                  pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair(&local_1d8);
                }
                pWStack_28 = (WatcherInotify *)0x0;
                local_2c = -1;
              }
              else {
                if ((bVar15) && (pWStack_28 != (WatcherInotify *)0x0)) {
                  std::make_pair<efsw::WatcherInotify*&,std::__cxx11::string&>
                            (&local_1b0,&stack0xffffffffffffffd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (rfds.fds_bits + 0xf));
                  std::
                  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push_back(&this->mMovedOutsideWatches,&local_1b0);
                  std::
                  pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair(&local_1b0);
                }
                ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                         operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>
                                     *)&currentMoveFrom);
                pWStack_28 = ppVar7->second;
                local_2c = *(int *)&lock.mMutex[1].mMutexImpl;
              }
            }
            else {
              pWStack_28 = (WatcherInotify *)0x0;
              local_2c = -1;
            }
          }
          bVar15 = ((ulong)(lock.mMutex)->mMutexImpl & 0x4000000000) != 0;
          if (((ulong)(lock.mMutex)->mMutexImpl & 0x4000000000) != 0) {
            pMVar8 = lock.mMutex + 2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f8,(char *)pMVar8,&local_1f9);
            std::__cxx11::string::operator=((string *)(rfds.fds_bits + 0xf),local_1f8);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          }
        }
      }
    }
    bVar4 = std::
            vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->mMovedOutsideWatches);
    if (!bVar4) {
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&it,&this->mMovedOutsideWatches);
      local_248._M_current =
           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&it);
      while( true ) {
        iStack_250 = std::
                     vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&it);
        bVar4 = __gnu_cxx::operator!=(&local_248,&stack0xfffffffffffffdb0);
        if (!bVar4) break;
        sVar9 = std::
                vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size(&this->mMovedOutsideWatches);
        sVar10 = std::
                 vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::size((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&it);
        if (sVar9 == sVar10) {
LAB_0011634e:
          ppVar12 = __gnu_cxx::
                    __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&local_248);
          pWVar2 = ppVar12->first;
          ppVar12 = __gnu_cxx::
                    __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&local_248);
          std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::vector
                    ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)&lock_1);
          Lock::Lock(&local_298,&this->mWatchesLock);
          while( true ) {
            oldWatch = (Watcher *)
                       std::
                       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                       ::end(&this->mWatches);
            bVar4 = std::operator!=((_Self *)&currentMoveFrom,(_Self *)&oldWatch);
            if (!bVar4) break;
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *
                                )&currentMoveFrom);
            local_2a8 = ppVar7->second;
            local_2e9 = 0;
            local_2ea = 0;
            bVar4 = false;
            if (local_2a8 != pWVar2) {
              std::operator+(local_2e8,&(pWVar2->super_Watcher).Directory);
              local_2e9 = 1;
              std::operator+(local_2c8,(char *)local_2e8);
              local_2ea = 1;
              iVar5 = String::strStartsWith(local_2c8,&(local_2a8->super_Watcher).Directory);
              bVar4 = iVar5 != -1;
            }
            if ((local_2ea & 1) != 0) {
              std::__cxx11::string::~string((string *)local_2c8);
            }
            if ((local_2e9 & 1) != 0) {
              std::__cxx11::string::~string((string *)local_2e8);
            }
            if (bVar4) {
              std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::push_back
                        ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)&lock_1,
                         (value_type *)&local_2a8);
            }
            std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *)
                       &currentMoveFrom);
          }
          Lock::~Lock(&local_298);
          local_2f8 = (Watcher **)
                      std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::begin
                                ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)
                                 &lock_1);
          local_300 = (Watcher **)
                      std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::end
                                ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)
                                 &lock_1);
          std::
          stable_sort<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,efsw::FileWatcherInotify::run()::__0>
                    (local_2f8,local_300);
          bVar4 = std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::empty
                            ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)&lock_1);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_328,"",(allocator *)((long)&eit.current._M_current + 7));
            (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                      (this,pWVar2,&ppVar12->second,0x200,local_328);
            std::__cxx11::string::~string(local_328);
            std::allocator<char>::~allocator((allocator<char> *)((long)&eit.current._M_current + 7))
            ;
          }
          else {
            std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::rbegin
                      ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)local_338);
            while( true ) {
              std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::rend
                        ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)&rmWatch);
              bVar4 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
                                       *)local_338,
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
                                       *)&rmWatch);
              if (!bVar4) break;
              ppWVar13 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
                                      *)local_338);
              cntWatch = *ppWVar13;
              std::__cxx11::string::string(local_370,(string *)&cntWatch->Directory);
              pWVar14 = watcherContainsDirectory(this,(string *)local_370);
              std::__cxx11::string::~string(local_370);
              local_350 = pWVar14;
              if (pWVar14 != (Watcher *)0x0) {
                std::__cxx11::string::string(local_3b0,(string *)&cntWatch->Directory);
                FileSystem::fileNameFromPath(local_390,(string *)local_3b0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3d0,"",&local_3d1);
                (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                          (this,pWVar14,local_390,0x200,local_3d0);
                std::__cxx11::string::~string(local_3d0);
                std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
                std::__cxx11::string::~string((string *)local_390);
                std::__cxx11::string::~string(local_3b0);
              }
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
              ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>_>
                            *)local_338);
            }
          }
          std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::~vector
                    ((vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> *)&lock_1);
        }
        else {
          itm._M_current._7_1_ = 0;
          local_260._M_current =
               (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin(&this->mMovedOutsideWatches);
          while( true ) {
            watch = (Watcher *)
                    std::
                    vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(&this->mMovedOutsideWatches);
            bVar4 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&watch,&local_260);
            if (!bVar4) break;
            ppVar11 = __gnu_cxx::
                      __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator->(&local_260);
            pWVar2 = ppVar11->first;
            ppVar11 = __gnu_cxx::
                      __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator->(&local_248);
            if (pWVar2 == ppVar11->first) {
              itm._M_current._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&local_260);
          }
          if ((itm._M_current._7_1_ & 1) != 0) goto LAB_0011634e;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_248);
      }
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&this->mMovedOutsideWatches);
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&it);
    }
    bVar4 = Atomic::operator_cast_to_bool((Atomic *)&(this->super_FileWatcherImpl).mInitOK);
    if (!bVar4) {
      if (wit._M_node != (_Base_ptr)0x0) {
        operator_delete__(wit._M_node);
      }
      std::__cxx11::string::~string((string *)(rfds.fds_bits + 0xf));
      return;
    }
  } while( true );
}

Assistant:

void FileWatcherInotify::run() {
	char* buff = new char[BUFF_SIZE];
	memset( buff, 0, BUFF_SIZE );
	WatchMap::iterator wit;

	WatcherInotify* currentMoveFrom = NULL;
	u_int32_t currentMoveCookie = -1;
	bool lastWasMovedFrom = false;
	std::string prevOldFileName;

	do {
		fd_set rfds;
		FD_ZERO( &rfds );
		FD_SET( mFD, &rfds );
		timeval timeout;
		timeout.tv_sec = 0;
		timeout.tv_usec = 100000;

		if ( select( FD_SETSIZE, &rfds, NULL, NULL, &timeout ) > 0 ) {
			ssize_t len;

			len = read( mFD, buff, BUFF_SIZE );

			if ( len != -1 ) {
				ssize_t i = 0;

				while ( i < len ) {
					struct inotify_event* pevent = (struct inotify_event*)&buff[i];

					{
						{
							Lock lock( mWatchesLock );

							wit = mWatches.find( pevent->wd );
						}

						if ( wit != mWatches.end() ) {
							handleAction( wit->second, (char*)pevent->name, pevent->mask );

							if ( ( pevent->mask & IN_MOVED_TO ) && wit->second == currentMoveFrom &&
								 pevent->cookie == currentMoveCookie ) {
								/// make pair success
								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							} else if ( pevent->mask & IN_MOVED_FROM ) {
								// Previous event was moved from and current event is moved from
								// Treat it as a DELETE or moved ouside watches
								if ( lastWasMovedFrom && currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = wit->second;
								currentMoveCookie = pevent->cookie;
							} else {
								/// Keep track of the IN_MOVED_FROM events to know
								/// if the IN_MOVED_TO event is also fired
								if ( currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							}
						}

						lastWasMovedFrom = ( pevent->mask & IN_MOVED_FROM ) != 0;
						if ( pevent->mask & IN_MOVED_FROM )
							prevOldFileName = std::string( (char*)pevent->name );
					}

					i += sizeof( struct inotify_event ) + pevent->len;
				}
			}
		} else {
			// Here means no event received
			// If last event is IN_MOVED_FROM, we assume no IN_MOVED_TO
			if ( currentMoveFrom ) {
				mMovedOutsideWatches.push_back(
					std::make_pair( currentMoveFrom, currentMoveFrom->OldFileName ) );
			}

			currentMoveFrom = NULL;
			currentMoveCookie = -1;
		}

		if ( !mMovedOutsideWatches.empty() ) {
			// We need to make a copy since the element mMovedOutsideWatches could be modified
			// during the iteration.
			std::vector<std::pair<WatcherInotify*, std::string>> movedOutsideWatches(
				mMovedOutsideWatches );

			/// In case that the IN_MOVED_TO is never fired means that the file was moved to other
			/// folder
			for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator it =
					  movedOutsideWatches.begin();
				  it != movedOutsideWatches.end(); ++it ) {

				// Skip if the watch has already being removed
				if ( mMovedOutsideWatches.size() != movedOutsideWatches.size() ) {
					bool found = false;
					for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
							  mMovedOutsideWatches.begin();
						  mMovedOutsideWatches.end() != itm; ++itm ) {
						if ( itm->first == it->first ) {
							found = true;
							break;
						}
					}
					if ( !found )
						continue;
				}

				Watcher* watch = ( *it ).first;
				const std::string& oldFileName = ( *it ).second;

				/// Check if the file move was a folder already being watched
				std::vector<Watcher*> eraseWatches;

				{
					Lock lock( mWatchesLock );

					for ( ; wit != mWatches.end(); ++wit ) {
						Watcher* oldWatch = wit->second;

						if ( oldWatch != watch &&
							 -1 != String::strStartsWith( watch->Directory + oldFileName + "/",
														  oldWatch->Directory ) ) {
							eraseWatches.push_back( oldWatch );
						}
					}
				}

				/// Remove invalid watches
				std::stable_sort( eraseWatches.begin(), eraseWatches.end(),
								  []( const Watcher* left, const Watcher* right ) {
									  return left->Directory < right->Directory;
								  } );

				if ( eraseWatches.empty() ) {
					handleAction( watch, oldFileName, IN_DELETE );
				} else {
					for ( std::vector<Watcher*>::reverse_iterator eit = eraseWatches.rbegin();
						  eit != eraseWatches.rend(); ++eit ) {
						Watcher* rmWatch = *eit;

						/// Create Delete event for removed watches that have been moved too
						if ( Watcher* cntWatch = watcherContainsDirectory( rmWatch->Directory ) ) {
							handleAction( cntWatch,
										  FileSystem::fileNameFromPath( rmWatch->Directory ),
										  IN_DELETE );
						}
					}
				}
			}

			mMovedOutsideWatches.clear();
		}
	} while ( mInitOK );

	delete[] buff;
}